

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O3

bool __thiscall
embree::motion_derivative_regression_test::run(motion_derivative_regression_test *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_float>
  __aurng;
  float fVar9;
  float __x;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  uint numRoots;
  AffineSpace3fa M1;
  Vec3fa axis;
  float roots [32];
  int local_4e8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_4d8;
  undefined8 local_4c8;
  long lStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  long lStack_4a0;
  undefined1 local_498 [8];
  undefined8 uStack_490;
  undefined1 local_488 [8];
  undefined8 uStack_480;
  undefined1 local_478 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_468;
  undefined8 local_458;
  long lStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  long lStack_430;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [16];
  float local_3d8;
  float local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  float fStack_3bc;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  float local_358 [32];
  MotionDerivativeCoefficients local_2d8;
  
  uVar7 = 0xb1413fa1;
  (this->rng)._M_x[0] = 0xb1413fa1;
  lVar4 = 1;
  lVar5 = 6;
  do {
    lVar6 = (uVar7 >> 0x3e ^ uVar7) * 0x5851f42d4c957f2d;
    uVar7 = lVar6 + lVar4;
    (this->rng)._M_x[lVar5 + -5] = (lVar5 + lVar6) - 5;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x13d);
  (this->rng)._M_p = 0x138;
  local_2d8.theta = -2.0;
  local_2d8.coeffs[0] = 2.0;
  local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
  MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
            ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4d8.m128,
             local_358,0x20);
  if (((local_4d8.m128[0] == 2.8026e-45) && (ABS(local_358[0] + 1.0) <= 1e+06)) &&
     (ABS(local_358[1] + -1.0) <= 1e+06)) {
    local_2d8.theta = -2.0;
    local_2d8.coeffs[0] = 2.0;
    local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
    MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
              ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4d8.m128,
               local_358,0x20);
    if (local_4d8.m128[0] == 2.8026e-45) {
      local_2d8.theta = -2.0;
      local_2d8.coeffs[0] = 2.0;
      local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
      MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4d8.m128,
                 local_358,0x20);
      if (local_4d8.m128[0] == 4.2039e-45) {
        local_2d8.theta = 0.5;
        local_2d8.coeffs[0] = 1.4;
        local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
        MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                  ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4d8.m128,
                   local_358,0x20);
        if (local_4d8.m128[0] == 4.2039e-45) {
          local_2d8.theta = 0.0;
          local_2d8.coeffs[0] = 7.0;
          local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
          MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                    ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,(uint *)local_4d8.m128,
                     local_358,0x20);
          if (local_4d8.m128[0] == 9.80909e-45) {
            local_2d8.theta = 0.0;
            local_2d8.coeffs[0] = 7.0;
            local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
            MotionDerivative::findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                      ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,
                       (uint *)local_4d8.m128,local_358,0x20);
            if (local_4d8.m128[0] == 9.80909e-45) {
              local_2d8.theta = 0.0;
              local_2d8.coeffs[0] = 2.0;
              local_4d8._0_8_ = local_4d8._0_8_ & 0xffffffff00000000;
              MotionDerivative::
              findRoots<embree::motion_derivative_regression_test::run()::EvalFunc>
                        ((EvalFunc *)&local_468.field_1,(Interval1f *)&local_2d8,
                         (uint *)local_4d8.m128,local_358,0x20);
              if (local_4d8.m128[0] == 9.80909e-45) {
                lVar4 = 0;
                do {
                  if (1e-06 < ABS(((float)(int)lVar4 * -3.1415927) / 10.0 + local_358[lVar4])) {
                    return false;
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 7);
                iVar8 = 0x40;
                while( true ) {
                  random_quaternion_decomposition((AffineSpace3fa *)&local_4d8.field_1,this);
                  random_quaternion_decomposition((AffineSpace3fa *)&local_468.field_1,this);
                  local_428._0_8_ = local_4d8._0_8_;
                  local_428._8_8_ = local_4d8._8_8_;
                  local_418 = local_4c8;
                  uStack_410 = lStack_4c0;
                  local_408 = local_4b8;
                  uStack_400 = uStack_4b0;
                  local_3f8 = local_4a8;
                  uStack_3f0 = lStack_4a0;
                  local_3b8._0_8_ = local_468._0_8_;
                  local_3b8._8_8_ = local_468._8_8_;
                  local_3a8 = local_458;
                  uStack_3a0 = lStack_450;
                  local_398 = local_448;
                  uStack_390 = uStack_440;
                  local_388 = local_438;
                  uStack_380 = lStack_430;
                  MotionDerivativeCoefficients::MotionDerivativeCoefficients
                            (&local_2d8,(AffineSpace3ff *)&local_428.field_1,
                             (AffineSpace3ff *)&local_3b8.field_1);
                  bVar3 = testMDC(this,&local_2d8);
                  if (!bVar3) break;
                  local_428._0_8_ = local_4d8._0_8_;
                  local_428._8_8_ = local_4d8._8_8_;
                  local_418 = local_4c8;
                  uStack_410 = lStack_4c0;
                  local_408 = local_4b8;
                  uStack_400 = uStack_4b0;
                  local_3f8 = local_4a8;
                  uStack_3f0 = lStack_4a0;
                  local_3b8._0_8_ = local_4d8._0_8_;
                  local_3b8._8_8_ = local_4d8._8_8_;
                  local_3a8 = local_4c8;
                  uStack_3a0 = lStack_4c0;
                  local_398 = local_4b8;
                  uStack_390 = uStack_4b0;
                  local_388 = local_4a8;
                  uStack_380 = lStack_4a0;
                  MotionDerivativeCoefficients::MotionDerivativeCoefficients
                            (&local_2d8,(AffineSpace3ff *)&local_428.field_1,
                             (AffineSpace3ff *)&local_3b8.field_1);
                  bVar3 = testMDC(this,&local_2d8);
                  if (!bVar3) {
                    return false;
                  }
                  iVar8 = iVar8 + -1;
                  if (iVar8 == 0) {
                    local_4e8 = 0;
                    do {
                      random_axis((motion_derivative_regression_test *)&local_428.field_1);
                      fVar9 = std::
                              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                                        (&this->rng);
                      fVar9 = (fVar9 + 0.0 + fVar9 + 0.0 + -1.0) * 6.2831855;
                      __x = fVar9 * 0.5;
                      iVar8 = 0;
                      do {
                        local_3e8 = ZEXT416((uint)(float)iVar8);
                        local_3d8 = powf(0.1,(float)iVar8);
                        _local_488 = ZEXT416((uint)local_428.m128[0]);
                        local_478 = ZEXT416((uint)local_428.m128[1]);
                        local_498._0_4_ = local_428.m128[2];
                        local_3c8 = cosf(__x);
                        fVar10 = sinf(__x);
                        fVar16 = local_488._0_4_;
                        auVar11._4_12_ = local_488._4_12_;
                        auVar11._0_4_ =
                             fVar16 * fVar16 +
                             (float)local_478._0_4_ * (float)local_478._0_4_ +
                             (float)local_498._0_4_ * (float)local_498._0_4_;
                        auVar12._4_4_ = local_488._4_4_;
                        auVar12._0_4_ = auVar11._0_4_;
                        auVar12._8_4_ = local_488._8_4_;
                        auVar12._12_4_ = local_488._12_4_;
                        auVar13 = rsqrtss(auVar12,auVar11);
                        fVar15 = auVar13._0_4_;
                        register0x00001304 = auVar13._4_12_;
                        fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * auVar11._0_4_ * 0.5 * fVar15;
                        local_488._0_4_ = fVar16 * fVar15 * fVar10;
                        local_478._0_4_ = (float)local_478._0_4_ * fVar15 * fVar10;
                        local_498._0_4_ = fVar15 * (float)local_498._0_4_ * fVar10;
                        local_368 = ZEXT416((uint)local_428.m128[0]);
                        local_378 = ZEXT416((uint)local_428.m128[1]);
                        uVar2 = local_428.m128[2];
                        unique0x10001309 = auVar11._4_12_;
                        fVar10 = std::
                                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                                           (&this->rng);
                        local_3e8._0_4_ =
                             ((float)(~-(uint)(0.5 < fVar10) & local_3e8._0_4_ |
                                     (local_3e8._0_4_ ^ 0x80000000) & -(uint)(0.5 < fVar10)) *
                              local_3d8 + fVar9) * 0.5;
                        local_3d8 = cosf((float)local_3e8._0_4_);
                        fVar10 = sinf((float)local_3e8._0_4_);
                        uStack_480._4_4_ = local_3c8;
                        uVar1 = local_498._0_4_;
                        fVar16 = (float)local_368._0_4_ * (float)local_368._0_4_ +
                                 (float)local_378._0_4_ * (float)local_378._0_4_ +
                                 (float)uVar2 * (float)uVar2;
                        auVar14._4_4_ = local_368._4_4_;
                        auVar14._0_4_ = fVar16;
                        auVar14._8_4_ = local_368._8_4_;
                        auVar14._12_4_ = local_368._12_4_;
                        auVar13._4_4_ = local_368._4_4_;
                        auVar13._0_4_ = fVar16;
                        auVar13._8_4_ = local_368._8_4_;
                        auVar13._12_4_ = local_368._12_4_;
                        auVar13 = rsqrtss(auVar14,auVar13);
                        fVar15 = auVar13._0_4_;
                        fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * fVar16 * 0.5 * fVar15;
                        fStack_3bc = (float)local_488._0_4_;
                        local_468._0_8_ = 0x3f800000;
                        local_468._8_8_ =
                             (ulong)(uint)((float)local_368._0_4_ * fVar15 * fVar10) << 0x20;
                        local_458 = 0x3f80000000000000;
                        lStack_450 = (ulong)(uint)((float)local_378._0_4_ * fVar15 * fVar10) << 0x20
                        ;
                        local_448 = 0;
                        uStack_440 = CONCAT44(fVar15 * (float)uVar2 * fVar10,0x3f800000);
                        local_438 = 0;
                        lStack_430 = (ulong)(uint)local_3d8 << 0x20;
                        local_3c8 = 1.0;
                        uStack_3c4 = 0;
                        uStack_3c0 = 0;
                        local_4d8._0_8_ = 0x3f800000;
                        local_4d8._8_8_ = (ulong)(uint)local_488._0_4_ << 0x20;
                        _local_498 = ZEXT812(0x3f80000000000000);
                        uStack_490._4_4_ = local_478._0_4_;
                        local_4c8 = 0x3f80000000000000;
                        lStack_4c0 = (ulong)local_478._0_4_ << 0x20;
                        local_478._0_12_ = ZEXT412(0x3f800000) << 0x40;
                        local_478._12_4_ = uVar1;
                        local_4b8 = 0;
                        uStack_4b0 = CONCAT44(uVar1,0x3f800000);
                        _local_488 = ZEXT812(0);
                        local_4a8 = 0;
                        lStack_4a0 = (ulong)(uint)uStack_480._4_4_ << 0x20;
                        MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                  (&local_2d8,(AffineSpace3ff *)&local_4d8.field_1,
                                   (AffineSpace3ff *)&local_468.field_1);
                        bVar3 = testMDC(this,&local_2d8);
                        if (!bVar3) {
                          return false;
                        }
                        local_4d8._0_8_ = CONCAT44(uStack_3c4,local_3c8);
                        local_4d8._8_8_ = CONCAT44(fStack_3bc,uStack_3c0);
                        local_4c8 = local_498;
                        lStack_4c0 = uStack_490;
                        local_4b8 = local_478._0_8_;
                        uStack_4b0 = local_478._8_8_;
                        local_4a8 = local_488;
                        lStack_4a0 = uStack_480;
                        local_458 = local_498;
                        lStack_450 = uStack_490;
                        local_448 = local_478._0_8_;
                        uStack_440 = local_478._8_8_;
                        local_438 = local_488;
                        lStack_430 = uStack_480;
                        local_468._0_8_ = local_4d8._0_8_;
                        local_468._8_8_ = local_4d8._8_8_;
                        MotionDerivativeCoefficients::MotionDerivativeCoefficients
                                  (&local_2d8,(AffineSpace3ff *)&local_4d8.field_1,
                                   (AffineSpace3ff *)&local_468.field_1);
                        bVar3 = testMDC(this,&local_2d8);
                        if (!bVar3) {
                          return false;
                        }
                        iVar8 = iVar8 + 1;
                      } while (iVar8 != 0x10);
                      local_4e8 = local_4e8 + 1;
                      if (local_4e8 == 0x40) {
                        return true;
                      }
                    } while( true );
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool run ()
    {
      bool passed = true;
#if 0
      std::random_device device;
      size_t seed = device();
#else
      // tests fails for this seed if MOTION_DERIVATIVE_ROOT_EPSILON is 1e-6f instead of 1e-4f
      size_t seed = 2973843361;
#endif
      rng.seed(seed);

      ////////////////////////////////////////////////////////////////////////////////
      // test root solver
      ////////////////////////////////////////////////////////////////////////////////
      unsigned int maxNumRoots = 32;
      float roots[32];
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
            return (t - 1.0) * (t + 1.0);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
        if (abs(roots[0]+1.f) > 1e6f) return false;
        if (abs(roots[1]-1.f) > 1e6f) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.99999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 2) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.9999f);
        }};
        Interval1f I(-2.f, 2.f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return (-7.831048f) + (70.619041f) + (-116.007454f) * t
            + ((-198.235809f) + ( 411.193054f) * t + (-160.020020f) * t * t) * cos(5.438017f * t)
            + ((-320.571472f) + ( 786.181946f) * t + (-559.993164f) * t * t) * sin(5.438017f * t);
        }};
        Interval1f I(0.5, 1.4f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 3) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1.0f) * 50 * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(t) * cos(t-1) * 0.0000001f * (t-2.0f) * (t-4.0f);
        }};
        Interval1f I(0.0, 7.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
      }
      {
        // all roots are of the form n*PI/10 for n = 0, 1, 2, ...
        // the function values vary from 0 to 3000
        // in a plot everything from 0 to 0.5 looks like constant zero
        struct EvalFunc { Interval1f operator()(Interval1f const& t) const {
          return sin(10.0f * t) * 100.0f * t*t*t*t*t;
        }};
        Interval1f I(0.0, 2.0f);
        unsigned int numRoots = 0;
        MotionDerivative::findRoots(EvalFunc(), I, numRoots, roots, maxNumRoots);
        if (numRoots != 7) return false;
        for (int i = 0; i < 7; ++i) {
          if (abs(roots[i]-(i*M_PI)/10.f) > 1e-6f)
            return false;
        }
      }

      ////////////////////////////////////////////////////////////////////////////////
      // test motion derivative coefficients
      ////////////////////////////////////////////////////////////////////////////////
      const size_t numTests = 64;

      // test completely random transformations
      for (int j = 0; j < numTests; ++j)
      {
        AffineSpace3fa M0 = random_quaternion_decomposition();
        AffineSpace3fa M1 = random_quaternion_decomposition();
        if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
        if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
      }

      // test transformations with slightly different rotation angles
      for (int j = 0; j < numTests; ++j)
      {
        Vec3fa axis = random_axis();
        float angle = 2.f * M_PI * (2.f * rand01() - 1.f);
        AffineSpace3fa S(one);
        Vec3fa T(0.f);

        for (int k = 0; k < 16; ++k)
        {
          float eps = pow(0.1f, k);
          Quaternion3f q0 = Quaternion3f::rotate(axis, angle);
          Quaternion3f q1 = Quaternion3f::rotate(axis, angle + (rand01() > 0.5f ? -1.f : 1.f) * k * eps);
          AffineSpace3fa M0 = quaternionDecomposition(T, q0, S);
          AffineSpace3fa M1 = quaternionDecomposition(T, q1, S);
          if (!testMDC(MotionDerivativeCoefficients(M0, M1))) return false;
          if (!testMDC(MotionDerivativeCoefficients(M0, M0))) return false;
        }
      }


      return passed;
    }